

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int constfolding(FuncState *fs,int op,expdesc *e1,expdesc *e2)

{
  int iVar1;
  bool bVar2;
  Value VVar3;
  TValue res;
  TValue v2;
  TValue v1;
  Value local_58;
  char local_50;
  Value local_48;
  undefined1 local_40;
  Value local_38;
  undefined1 local_30;
  
  if (e1->t != e1->f) {
    return 0;
  }
  if (e1->k == VKINT) {
    local_30 = 3;
  }
  else {
    if (e1->k != VKFLT) {
      return 0;
    }
    local_30 = 0x13;
  }
  local_38 = *(Value *)&e1->u;
  if (e2->t != e2->f) {
    return 0;
  }
  if (e2->k == VKINT) {
    local_40 = 3;
    bVar2 = true;
  }
  else {
    if (e2->k != VKFLT) {
      return 0;
    }
    local_40 = 0x13;
    bVar2 = false;
  }
  local_48 = (Value)(e2->u).nval;
  if ((uint)op < 0xe) {
    if ((0x2f80U >> (op & 0x1fU) & 1) == 0) {
      if ((0x68U >> (op & 0x1fU) & 1) == 0) goto LAB_0011c428;
      VVar3 = local_48;
      if (bVar2) {
        VVar3.n = (lua_Number)local_48.i;
      }
      bVar2 = VVar3.n != 0.0;
    }
    else {
      bVar2 = false;
      iVar1 = luaV_tointegerns((TValue *)&local_38,&local_58.i,F2Ieq);
      if (iVar1 != 0) {
        iVar1 = luaV_tointegerns((TValue *)&local_48,&local_58.i,F2Ieq);
        bVar2 = iVar1 != 0;
      }
    }
    if (!bVar2) {
      return 0;
    }
  }
LAB_0011c428:
  luaO_rawarith(fs->ls->L,op,(TValue *)&local_38,(TValue *)&local_48,(TValue *)&local_58);
  if (local_50 == '\x03') {
    e1->k = VKINT;
    (e1->u).nval = (lua_Number)local_58;
  }
  else {
    if (local_58.n == 0.0) {
      return 0;
    }
    e1->k = VKFLT;
    (e1->u).nval = (lua_Number)local_58;
  }
  return 1;
}

Assistant:

static int constfolding (FuncState *fs, int op, expdesc *e1,
                                        const expdesc *e2) {
  TValue v1, v2, res;
  if (!tonumeral(e1, &v1) || !tonumeral(e2, &v2) || !validop(op, &v1, &v2))
    return 0;  /* non-numeric operands or not safe to fold */
  luaO_rawarith(fs->ls->L, op, &v1, &v2, &res);  /* does operation */
  if (ttisinteger(&res)) {
    e1->k = VKINT;
    e1->u.ival = ivalue(&res);
  }
  else {  /* folds neither NaN nor 0.0 (to avoid problems with -0.0) */
    lua_Number n = fltvalue(&res);
    if (luai_numisnan(n) || n == 0)
      return 0;
    e1->k = VKFLT;
    e1->u.nval = n;
  }
  return 1;
}